

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O2

void Eigen::internal::
     nnls_householder_qr_inplace_update<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>>
               (Matrix<float,__1,__1,_0,__1,__1> *mat,Matrix<float,__1,_1,_0,__1,_1> *hCoeffs,
               Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *newColumn,Index k,
               Scalar *tempData)

{
  long lVar1;
  long i;
  long n;
  long lVar2;
  Matrix<float,__1,_1,_0,__1,_1> tempVector;
  RealScalar beta;
  Scalar *local_1a0;
  PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> local_188;
  long local_178;
  Type local_170;
  float local_108 [14];
  Type local_d0;
  Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> local_68;
  
  lVar1 = (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (lVar1 <= k) {
    __assert_fail("k < mat.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                  ,0x102,
                  "void Eigen::internal::nnls_householder_qr_inplace_update(MatrixQR &, HCoeffs &, const VectorQR &, typename MatrixQR::Index, typename MatrixQR::Scalar *) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, VectorQR = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>]"
                 );
  }
  n = (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_178 = n - k;
  if (local_178 == 0 || n < k) {
    __assert_fail("k < rows",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                  ,0x103,
                  "void Eigen::internal::nnls_householder_qr_inplace_update(MatrixQR &, HCoeffs &, const VectorQR &, typename MatrixQR::Index, typename MatrixQR::Scalar *) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, VectorQR = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>]"
                 );
  }
  if ((hCoeffs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      lVar1) {
    __assert_fail("hCoeffs.size() == mat.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                  ,0x104,
                  "void Eigen::internal::nnls_householder_qr_inplace_update(MatrixQR &, HCoeffs &, const VectorQR &, typename MatrixQR::Index, typename MatrixQR::Scalar *) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, VectorQR = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>]"
                 );
  }
  if ((newColumn->
      super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>).
      super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value == n) {
    local_188.m_storage.m_data = (Scalar *)0x0;
    local_188.m_storage.m_rows = 0;
    local_1a0 = tempData;
    if (tempData == (Scalar *)0x0) {
      PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::resize(&local_188,lVar1);
      local_1a0 = local_188.m_storage.m_data;
    }
    Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_170,mat,k);
    call_assignment<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>>
              ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_170,newColumn);
    lVar2 = 0;
    lVar1 = 0;
    if (0 < k) {
      lVar1 = k;
    }
    for (i = 0; lVar1 != i; i = i + 1) {
      Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_108,mat,k);
      DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail<long>
                (&local_170,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 local_108,n);
      Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block(&local_68,mat,i);
      n = n + -1;
      DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail<long>
                (&local_d0,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 &local_68,n);
      MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,1,true>,-1,1,false>>
      ::
      applyHouseholderOnTheLeft<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,_1>>
                ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>>
                  *)&local_170,&local_d0,
                 (Scalar *)
                 ((long)(hCoeffs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data + lVar2),(Scalar *)((long)local_1a0 + lVar2 + 4));
      lVar2 = lVar2 + 4;
    }
    Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_d0,mat,k);
    DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail<long>
              (&local_170,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               &local_d0,local_178);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>
    ::makeHouseholderInPlace
              ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
                *)&local_170,
               (hCoeffs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
               m_data + k,local_108);
    (mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_data
    [(mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows * k + k
    ] = local_108[0];
    free(local_188.m_storage.m_data);
    return;
  }
  __assert_fail("newColumn.size() == rows",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                ,0x105,
                "void Eigen::internal::nnls_householder_qr_inplace_update(MatrixQR &, HCoeffs &, const VectorQR &, typename MatrixQR::Index, typename MatrixQR::Scalar *) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, VectorQR = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>]"
               );
}

Assistant:

void nnls_householder_qr_inplace_update(MatrixQR& mat, HCoeffs &hCoeffs,
                                        const VectorQR &newColumn,
                                        typename MatrixQR::Index k,
                                        typename MatrixQR::Scalar* tempData = 0)
{
  typedef typename MatrixQR::Index Index;
  typedef typename MatrixQR::Scalar Scalar;
  typedef typename MatrixQR::RealScalar RealScalar;
  Index rows = mat.rows();

  eigen_assert(k < mat.cols());
  eigen_assert(k < rows);
  eigen_assert(hCoeffs.size() == mat.cols());
  eigen_assert(newColumn.size() == rows);

  Matrix<Scalar,Dynamic,1,ColMajor,MatrixQR::MaxColsAtCompileTime,1> tempVector;
  if(tempData == 0) {
    tempVector.resize(mat.cols());
    tempData = tempVector.data();
  }

  // Store new column in mat at column k
  mat.col(k) = newColumn;
  // Apply H = H_1...H_{k-1} on newColumn (skip if k=0)
  for (Index i=0; i<k; ++i) {
    Index remainingRows = rows - i;
    mat.col(k).tail(remainingRows).applyHouseholderOnTheLeft(
          mat.col(i).tail(remainingRows-1), hCoeffs.coeffRef(i), tempData+i+1);
  }
  // Construct Householder projector in-place in column k
  RealScalar beta;
  mat.col(k).tail(rows-k).makeHouseholderInPlace(hCoeffs.coeffRef(k), beta);
  mat.coeffRef(k,k) = beta;
}